

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft_world.cc
# Opt level: O1

void sptk::world::rdft(int n,int isgn,double *a,int *ip,double *w)

{
  int nw;
  int nc;
  double dVar1;
  double dVar2;
  
  nw = *ip;
  nc = ip[1];
  if (isgn < 0) {
    dVar2 = (*a - a[1]) * 0.5;
    a[1] = dVar2;
    dVar1 = *a - dVar2;
    *a = dVar1;
    if (4 < n) {
      rftbsub(n,a,nc,w + nw);
      cftbsub(n,a,ip,nw,w);
      return;
    }
    if (n == 4) {
      *a = dVar1 + a[2];
      a[1] = dVar2 + a[3];
      a[2] = dVar1 - a[2];
      a[3] = dVar2 - a[3];
    }
  }
  else {
    if (n < 5) {
      if (n == 4) {
        dVar1 = *a;
        dVar2 = a[1];
        *a = dVar1 + a[2];
        a[1] = dVar2 + a[3];
        a[2] = dVar1 - a[2];
        a[3] = dVar2 - a[3];
      }
    }
    else {
      cftfsub(n,a,ip,nw,w);
      rftfsub(n,a,nc,w + nw);
    }
    dVar1 = *a;
    *a = dVar1 + a[1];
    a[1] = dVar1 - a[1];
  }
  return;
}

Assistant:

void rdft(int n, int isgn, double *a, int *ip, double *w) {
#if 0
  void cftfsub(int n, double *a, int *ip, int nw, double *w);
  void cftbsub(int n, double *a, int *ip, int nw, double *w);
  void rftfsub(int n, double *a, int nc, double *c);
  void rftbsub(int n, double *a, int nc, double *c);
#endif
  double xi;

  int nw = ip[0];
  int nc = ip[1];

  if (isgn >= 0) {
    if (n > 4) {
      cftfsub(n, a, ip, nw, w);
      rftfsub(n, a, nc, w + nw);
    } else if (n == 4) {
      cftfsub(n, a, ip, nw, w);
    }
    xi = a[0] - a[1];
    a[0] += a[1];
    a[1] = xi;
  } else {
    a[1] = 0.5 * (a[0] - a[1]);
    a[0] -= a[1];
    if (n > 4) {
      rftbsub(n, a, nc, w + nw);
      cftbsub(n, a, ip, nw, w);
    } else if (n == 4) {
      cftbsub(n, a, ip, nw, w);
    }
  }
}